

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall leveldb::FindFileTest::~FindFileTest(FindFileTest *this)

{
  FileMetaData *pFVar1;
  pointer pcVar2;
  pointer ppFVar3;
  ulong uVar4;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FindFileTest_001676f8;
  ppFVar3 = (this->files_).
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->files_).
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppFVar3) {
    uVar4 = 0;
    do {
      pFVar1 = ppFVar3[uVar4];
      if (pFVar1 != (FileMetaData *)0x0) {
        pcVar2 = (pFVar1->largest).rep_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(pFVar1->largest).rep_.field_2) {
          operator_delete(pcVar2);
        }
        pcVar2 = (pFVar1->smallest).rep_._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &(pFVar1->smallest).rep_.field_2) {
          operator_delete(pcVar2);
        }
        operator_delete(pFVar1);
      }
      uVar4 = uVar4 + 1;
      ppFVar3 = (this->files_).
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->files_).
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >> 3))
    ;
  }
  if (ppFVar3 != (pointer)0x0) {
    operator_delete(ppFVar3);
  }
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~FindFileTest() {
    for (int i = 0; i < files_.size(); i++) {
      delete files_[i];
    }
  }